

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

int __thiscall
google::protobuf::internal::ExtensionSet::Extension::ByteSize(Extension *this,int number)

{
  bool bVar1;
  FieldType FVar2;
  int iVar3;
  int iVar4;
  LogMessage *other;
  int *piVar5;
  uint *puVar6;
  Type *pTVar7;
  long *plVar8;
  uint64 *puVar9;
  unsigned_long *puVar10;
  Type *pTVar11;
  uint32 uVar12;
  int i;
  int iVar13;
  RepeatedField<unsigned_int> *this_00;
  RepeatedField<int> *pRVar14;
  RepeatedField<long> *pRVar15;
  RepeatedField<unsigned_long> *this_01;
  RepeatedPtrFieldBase *pRVar16;
  LogFinisher local_59;
  LogMessage local_58;
  
  if (this->is_repeated == true) {
    bVar1 = this->is_packed;
    FVar2 = anon_unknown_0::real_type(this->type);
    if (bVar1 != true) {
      iVar3 = WireFormatLite::TagSize(number,FVar2);
      FVar2 = anon_unknown_0::real_type(this->type);
      switch(FVar2) {
      case TYPE_DOUBLE:
      case TYPE_FIXED64:
      case TYPE_SFIXED64:
        iVar3 = iVar3 + 8;
        break;
      case TYPE_FLOAT:
      case TYPE_FIXED32:
      case TYPE_SFIXED32:
        iVar3 = iVar3 + 4;
        break;
      case TYPE_INT64:
        pRVar15 = (this->field_0).repeated_int64_value;
        iVar4 = pRVar15->current_size_;
        iVar3 = iVar3 * iVar4;
        for (iVar13 = 0; iVar13 < iVar4; iVar13 = iVar13 + 1) {
          puVar9 = (uint64 *)RepeatedField<long>::Get(pRVar15,iVar13);
          iVar4 = io::CodedOutputStream::VarintSize64(*puVar9);
          iVar3 = iVar3 + iVar4;
          pRVar15 = (this->field_0).repeated_int64_value;
          iVar4 = pRVar15->current_size_;
        }
        return iVar3;
      case TYPE_UINT64:
        this_01 = (this->field_0).repeated_uint64_value;
        iVar4 = this_01->current_size_;
        iVar3 = iVar3 * iVar4;
        for (iVar13 = 0; iVar13 < iVar4; iVar13 = iVar13 + 1) {
          puVar10 = RepeatedField<unsigned_long>::Get(this_01,iVar13);
          iVar4 = io::CodedOutputStream::VarintSize64(*puVar10);
          iVar3 = iVar3 + iVar4;
          this_01 = (this->field_0).repeated_uint64_value;
          iVar4 = this_01->current_size_;
        }
        return iVar3;
      case TYPE_INT32:
        pRVar14 = (this->field_0).repeated_int32_value;
        iVar4 = pRVar14->current_size_;
        iVar3 = iVar3 * iVar4;
        for (iVar13 = 0; iVar13 < iVar4; iVar13 = iVar13 + 1) {
          piVar5 = RepeatedField<int>::Get(pRVar14,iVar13);
          iVar4 = io::CodedOutputStream::VarintSize32SignExtended(*piVar5);
          iVar3 = iVar3 + iVar4;
          pRVar14 = (this->field_0).repeated_int32_value;
          iVar4 = pRVar14->current_size_;
        }
        return iVar3;
      case TYPE_BOOL:
        iVar3 = iVar3 + 1;
        break;
      case TYPE_STRING:
        pRVar16 = (RepeatedPtrFieldBase *)(this->field_0).repeated_int32_value;
        iVar4 = pRVar16->current_size_;
        iVar3 = iVar3 * iVar4;
        for (iVar13 = 0; iVar13 < iVar4; iVar13 = iVar13 + 1) {
          pTVar11 = RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                              (pRVar16,iVar13);
          iVar4 = WireFormatLite::StringSize(pTVar11);
          iVar3 = iVar3 + iVar4;
          pRVar16 = (RepeatedPtrFieldBase *)(this->field_0).repeated_int32_value;
          iVar4 = pRVar16->current_size_;
        }
        return iVar3;
      case TYPE_GROUP:
        pRVar16 = (RepeatedPtrFieldBase *)(this->field_0).repeated_int32_value;
        iVar4 = pRVar16->current_size_;
        iVar3 = iVar3 * iVar4;
        for (iVar13 = 0; iVar13 < iVar4; iVar13 = iVar13 + 1) {
          pTVar7 = RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
                             (pRVar16,iVar13);
          iVar4 = (*pTVar7->_vptr_MessageLite[9])(pTVar7);
          iVar3 = iVar3 + iVar4;
          pRVar16 = (RepeatedPtrFieldBase *)(this->field_0).repeated_int32_value;
          iVar4 = pRVar16->current_size_;
        }
        return iVar3;
      case TYPE_MESSAGE:
        pRVar16 = (RepeatedPtrFieldBase *)(this->field_0).repeated_int32_value;
        iVar4 = pRVar16->current_size_;
        iVar3 = iVar3 * iVar4;
        for (iVar13 = 0; iVar13 < iVar4; iVar13 = iVar13 + 1) {
          pTVar7 = RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
                             (pRVar16,iVar13);
          iVar4 = WireFormatLite::MessageSize(pTVar7);
          iVar3 = iVar3 + iVar4;
          pRVar16 = (RepeatedPtrFieldBase *)(this->field_0).repeated_int32_value;
          iVar4 = pRVar16->current_size_;
        }
        return iVar3;
      case TYPE_BYTES:
        pRVar16 = (RepeatedPtrFieldBase *)(this->field_0).repeated_int32_value;
        iVar4 = pRVar16->current_size_;
        iVar3 = iVar3 * iVar4;
        for (iVar13 = 0; iVar13 < iVar4; iVar13 = iVar13 + 1) {
          pTVar11 = RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                              (pRVar16,iVar13);
          iVar4 = WireFormatLite::BytesSize(pTVar11);
          iVar3 = iVar3 + iVar4;
          pRVar16 = (RepeatedPtrFieldBase *)(this->field_0).repeated_int32_value;
          iVar4 = pRVar16->current_size_;
        }
        return iVar3;
      case TYPE_UINT32:
        this_00 = (this->field_0).repeated_uint32_value;
        iVar4 = this_00->current_size_;
        iVar3 = iVar3 * iVar4;
        for (iVar13 = 0; iVar13 < iVar4; iVar13 = iVar13 + 1) {
          puVar6 = RepeatedField<unsigned_int>::Get(this_00,iVar13);
          iVar4 = io::CodedOutputStream::VarintSize32(*puVar6);
          iVar3 = iVar3 + iVar4;
          this_00 = (this->field_0).repeated_uint32_value;
          iVar4 = this_00->current_size_;
        }
        return iVar3;
      case TYPE_ENUM:
        pRVar14 = (this->field_0).repeated_int32_value;
        iVar4 = pRVar14->current_size_;
        iVar3 = iVar3 * iVar4;
        for (iVar13 = 0; iVar13 < iVar4; iVar13 = iVar13 + 1) {
          piVar5 = RepeatedField<int>::Get(pRVar14,iVar13);
          iVar4 = io::CodedOutputStream::VarintSize32SignExtended(*piVar5);
          iVar3 = iVar3 + iVar4;
          pRVar14 = (this->field_0).repeated_int32_value;
          iVar4 = pRVar14->current_size_;
        }
        return iVar3;
      case TYPE_SINT32:
        pRVar14 = (this->field_0).repeated_int32_value;
        iVar4 = pRVar14->current_size_;
        iVar3 = iVar3 * iVar4;
        for (iVar13 = 0; iVar13 < iVar4; iVar13 = iVar13 + 1) {
          piVar5 = RepeatedField<int>::Get(pRVar14,iVar13);
          iVar4 = WireFormatLite::SInt32Size(*piVar5);
          iVar3 = iVar3 + iVar4;
          pRVar14 = (this->field_0).repeated_int32_value;
          iVar4 = pRVar14->current_size_;
        }
        return iVar3;
      case MAX_FIELD_TYPE:
        pRVar15 = (this->field_0).repeated_int64_value;
        iVar4 = pRVar15->current_size_;
        iVar3 = iVar3 * iVar4;
        for (iVar13 = 0; iVar13 < iVar4; iVar13 = iVar13 + 1) {
          plVar8 = RepeatedField<long>::Get(pRVar15,iVar13);
          iVar4 = WireFormatLite::SInt64Size(*plVar8);
          iVar3 = iVar3 + iVar4;
          pRVar15 = (this->field_0).repeated_int64_value;
          iVar4 = pRVar15->current_size_;
        }
        return iVar3;
      default:
        return 0;
      }
      return iVar3 * ((this->field_0).repeated_int32_value)->current_size_;
    }
    switch(FVar2) {
    case TYPE_DOUBLE:
    case TYPE_FIXED64:
    case TYPE_SFIXED64:
      uVar12 = ((this->field_0).repeated_int32_value)->current_size_ << 3;
      break;
    case TYPE_FLOAT:
    case TYPE_FIXED32:
    case TYPE_SFIXED32:
      uVar12 = ((this->field_0).repeated_int32_value)->current_size_ << 2;
      break;
    case TYPE_INT64:
      uVar12 = 0;
      for (iVar3 = 0; iVar3 < ((this->field_0).repeated_int64_value)->current_size_;
          iVar3 = iVar3 + 1) {
        puVar9 = (uint64 *)RepeatedField<long>::Get((this->field_0).repeated_int64_value,iVar3);
        iVar4 = io::CodedOutputStream::VarintSize64(*puVar9);
        uVar12 = uVar12 + iVar4;
      }
      break;
    case TYPE_UINT64:
      uVar12 = 0;
      for (iVar3 = 0; iVar3 < ((this->field_0).repeated_uint64_value)->current_size_;
          iVar3 = iVar3 + 1) {
        puVar10 = RepeatedField<unsigned_long>::Get((this->field_0).repeated_uint64_value,iVar3);
        iVar4 = io::CodedOutputStream::VarintSize64(*puVar10);
        uVar12 = uVar12 + iVar4;
      }
      break;
    case TYPE_INT32:
      uVar12 = 0;
      for (iVar3 = 0; iVar3 < ((this->field_0).repeated_int32_value)->current_size_;
          iVar3 = iVar3 + 1) {
        piVar5 = RepeatedField<int>::Get((this->field_0).repeated_int32_value,iVar3);
        iVar4 = io::CodedOutputStream::VarintSize32SignExtended(*piVar5);
        uVar12 = uVar12 + iVar4;
      }
      break;
    case TYPE_BOOL:
      uVar12 = ((this->field_0).repeated_int32_value)->current_size_;
      break;
    case TYPE_STRING:
    case TYPE_GROUP:
    case TYPE_MESSAGE:
    case TYPE_BYTES:
      LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
                 ,0x50d);
      other = LogMessage::operator<<(&local_58,"Non-primitive types can\'t be packed.");
      LogFinisher::operator=(&local_59,other);
      LogMessage::~LogMessage(&local_58);
    default:
      this->cached_size = 0;
      return 0;
    case TYPE_UINT32:
      uVar12 = 0;
      for (iVar3 = 0; iVar3 < ((this->field_0).repeated_uint32_value)->current_size_;
          iVar3 = iVar3 + 1) {
        puVar6 = RepeatedField<unsigned_int>::Get((this->field_0).repeated_uint32_value,iVar3);
        iVar4 = io::CodedOutputStream::VarintSize32(*puVar6);
        uVar12 = uVar12 + iVar4;
      }
      break;
    case TYPE_ENUM:
      uVar12 = 0;
      for (iVar3 = 0; iVar3 < ((this->field_0).repeated_int32_value)->current_size_;
          iVar3 = iVar3 + 1) {
        piVar5 = RepeatedField<int>::Get((this->field_0).repeated_int32_value,iVar3);
        iVar4 = io::CodedOutputStream::VarintSize32SignExtended(*piVar5);
        uVar12 = uVar12 + iVar4;
      }
      break;
    case TYPE_SINT32:
      uVar12 = 0;
      for (iVar3 = 0; iVar3 < ((this->field_0).repeated_int32_value)->current_size_;
          iVar3 = iVar3 + 1) {
        piVar5 = RepeatedField<int>::Get((this->field_0).repeated_int32_value,iVar3);
        iVar4 = WireFormatLite::SInt32Size(*piVar5);
        uVar12 = uVar12 + iVar4;
      }
      break;
    case MAX_FIELD_TYPE:
      uVar12 = 0;
      for (iVar3 = 0; iVar3 < ((this->field_0).repeated_int64_value)->current_size_;
          iVar3 = iVar3 + 1) {
        plVar8 = RepeatedField<long>::Get((this->field_0).repeated_int64_value,iVar3);
        iVar4 = WireFormatLite::SInt64Size(*plVar8);
        uVar12 = uVar12 + iVar4;
      }
    }
    this->cached_size = uVar12;
    if (0 < (int)uVar12) {
      iVar3 = io::CodedOutputStream::VarintSize32(uVar12);
      iVar4 = io::CodedOutputStream::VarintSize32(number * 8 + 2);
      return iVar4 + iVar3 + uVar12;
    }
    return uVar12;
  }
  if ((this->field_0xa & 1) != 0) {
    return 0;
  }
  FVar2 = anon_unknown_0::real_type(this->type);
  iVar3 = WireFormatLite::TagSize(number,FVar2);
  FVar2 = anon_unknown_0::real_type(this->type);
  switch(FVar2) {
  case TYPE_DOUBLE:
  case TYPE_FIXED64:
  case TYPE_SFIXED64:
    return iVar3 + 8;
  case TYPE_FLOAT:
  case TYPE_FIXED32:
  case TYPE_SFIXED32:
    return iVar3 + 4;
  case TYPE_INT64:
  case TYPE_UINT64:
    iVar4 = io::CodedOutputStream::VarintSize64((this->field_0).uint64_value);
    break;
  case TYPE_INT32:
  case TYPE_ENUM:
    iVar4 = io::CodedOutputStream::VarintSize32SignExtended((this->field_0).int32_value);
    break;
  case TYPE_BOOL:
    return iVar3 + 1;
  case TYPE_STRING:
    iVar4 = WireFormatLite::StringSize((this->field_0).string_value);
    break;
  case TYPE_GROUP:
    iVar4 = (**(code **)(((this->field_0).repeated_int32_value)->elements_ + 0x12))();
    break;
  case TYPE_MESSAGE:
    if ((this->field_0xa & 0x10) == 0) {
      iVar4 = WireFormatLite::MessageSize((this->field_0).message_value);
    }
    else {
      uVar12 = (*((this->field_0).message_value)->_vptr_MessageLite[8])();
      iVar4 = io::CodedOutputStream::VarintSize32(uVar12);
      iVar3 = iVar3 + uVar12;
    }
    break;
  case TYPE_BYTES:
    iVar4 = WireFormatLite::BytesSize((this->field_0).string_value);
    break;
  case TYPE_UINT32:
    iVar4 = io::CodedOutputStream::VarintSize32((this->field_0).uint32_value);
    break;
  case TYPE_SINT32:
    iVar4 = WireFormatLite::SInt32Size((this->field_0).int32_value);
    break;
  case MAX_FIELD_TYPE:
    iVar4 = WireFormatLite::SInt64Size((this->field_0).int64_value);
    break;
  default:
    goto switchD_00209071_default;
  }
  iVar3 = iVar3 + iVar4;
switchD_00209071_default:
  return iVar3;
}

Assistant:

int ExtensionSet::Extension::ByteSize(int number) const {
  int result = 0;

  if (is_repeated) {
    if (is_packed) {
      switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                        \
        case WireFormatLite::TYPE_##UPPERCASE:                              \
          for (int i = 0; i < repeated_##LOWERCASE##_value->size(); i++) {  \
            result += WireFormatLite::CAMELCASE##Size(                      \
              repeated_##LOWERCASE##_value->Get(i));                        \
          }                                                                 \
          break

        HANDLE_TYPE(   INT32,    Int32,   int32);
        HANDLE_TYPE(   INT64,    Int64,   int64);
        HANDLE_TYPE(  UINT32,   UInt32,  uint32);
        HANDLE_TYPE(  UINT64,   UInt64,  uint64);
        HANDLE_TYPE(  SINT32,   SInt32,   int32);
        HANDLE_TYPE(  SINT64,   SInt64,   int64);
        HANDLE_TYPE(    ENUM,     Enum,    enum);
#undef HANDLE_TYPE

        // Stuff with fixed size.
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                        \
        case WireFormatLite::TYPE_##UPPERCASE:                              \
          result += WireFormatLite::k##CAMELCASE##Size *                    \
                    repeated_##LOWERCASE##_value->size();                   \
          break
        HANDLE_TYPE( FIXED32,  Fixed32, uint32);
        HANDLE_TYPE( FIXED64,  Fixed64, uint64);
        HANDLE_TYPE(SFIXED32, SFixed32,  int32);
        HANDLE_TYPE(SFIXED64, SFixed64,  int64);
        HANDLE_TYPE(   FLOAT,    Float,  float);
        HANDLE_TYPE(  DOUBLE,   Double, double);
        HANDLE_TYPE(    BOOL,     Bool,   bool);
#undef HANDLE_TYPE

        case WireFormatLite::TYPE_STRING:
        case WireFormatLite::TYPE_BYTES:
        case WireFormatLite::TYPE_GROUP:
        case WireFormatLite::TYPE_MESSAGE:
          GOOGLE_LOG(FATAL) << "Non-primitive types can't be packed.";
          break;
      }

      cached_size = result;
      if (result > 0) {
        result += io::CodedOutputStream::VarintSize32(result);
        result += io::CodedOutputStream::VarintSize32(
            WireFormatLite::MakeTag(number,
                WireFormatLite::WIRETYPE_LENGTH_DELIMITED));
      }
    } else {
      int tag_size = WireFormatLite::TagSize(number, real_type(type));

      switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                        \
        case WireFormatLite::TYPE_##UPPERCASE:                              \
          result += tag_size * repeated_##LOWERCASE##_value->size();        \
          for (int i = 0; i < repeated_##LOWERCASE##_value->size(); i++) {  \
            result += WireFormatLite::CAMELCASE##Size(                      \
              repeated_##LOWERCASE##_value->Get(i));                        \
          }                                                                 \
          break

        HANDLE_TYPE(   INT32,    Int32,   int32);
        HANDLE_TYPE(   INT64,    Int64,   int64);
        HANDLE_TYPE(  UINT32,   UInt32,  uint32);
        HANDLE_TYPE(  UINT64,   UInt64,  uint64);
        HANDLE_TYPE(  SINT32,   SInt32,   int32);
        HANDLE_TYPE(  SINT64,   SInt64,   int64);
        HANDLE_TYPE(  STRING,   String,  string);
        HANDLE_TYPE(   BYTES,    Bytes,  string);
        HANDLE_TYPE(    ENUM,     Enum,    enum);
        HANDLE_TYPE(   GROUP,    Group, message);
        HANDLE_TYPE( MESSAGE,  Message, message);
#undef HANDLE_TYPE

        // Stuff with fixed size.
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                        \
        case WireFormatLite::TYPE_##UPPERCASE:                              \
          result += (tag_size + WireFormatLite::k##CAMELCASE##Size) *       \
                    repeated_##LOWERCASE##_value->size();                   \
          break
        HANDLE_TYPE( FIXED32,  Fixed32, uint32);
        HANDLE_TYPE( FIXED64,  Fixed64, uint64);
        HANDLE_TYPE(SFIXED32, SFixed32,  int32);
        HANDLE_TYPE(SFIXED64, SFixed64,  int64);
        HANDLE_TYPE(   FLOAT,    Float,  float);
        HANDLE_TYPE(  DOUBLE,   Double, double);
        HANDLE_TYPE(    BOOL,     Bool,   bool);
#undef HANDLE_TYPE
      }
    }
  } else if (!is_cleared) {
    result += WireFormatLite::TagSize(number, real_type(type));
    switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                      \
      case WireFormatLite::TYPE_##UPPERCASE:                              \
        result += WireFormatLite::CAMELCASE##Size(LOWERCASE);             \
        break

      HANDLE_TYPE(   INT32,    Int32,    int32_value);
      HANDLE_TYPE(   INT64,    Int64,    int64_value);
      HANDLE_TYPE(  UINT32,   UInt32,   uint32_value);
      HANDLE_TYPE(  UINT64,   UInt64,   uint64_value);
      HANDLE_TYPE(  SINT32,   SInt32,    int32_value);
      HANDLE_TYPE(  SINT64,   SInt64,    int64_value);
      HANDLE_TYPE(  STRING,   String,  *string_value);
      HANDLE_TYPE(   BYTES,    Bytes,  *string_value);
      HANDLE_TYPE(    ENUM,     Enum,     enum_value);
      HANDLE_TYPE(   GROUP,    Group, *message_value);
#undef HANDLE_TYPE
      case WireFormatLite::TYPE_MESSAGE: {
        if (is_lazy) {
          int size = lazymessage_value->ByteSize();
          result += io::CodedOutputStream::VarintSize32(size) + size;
        } else {
          result += WireFormatLite::MessageSize(*message_value);
        }
        break;
      }

      // Stuff with fixed size.
#define HANDLE_TYPE(UPPERCASE, CAMELCASE)                                 \
      case WireFormatLite::TYPE_##UPPERCASE:                              \
        result += WireFormatLite::k##CAMELCASE##Size;                     \
        break
      HANDLE_TYPE( FIXED32,  Fixed32);
      HANDLE_TYPE( FIXED64,  Fixed64);
      HANDLE_TYPE(SFIXED32, SFixed32);
      HANDLE_TYPE(SFIXED64, SFixed64);
      HANDLE_TYPE(   FLOAT,    Float);
      HANDLE_TYPE(  DOUBLE,   Double);
      HANDLE_TYPE(    BOOL,     Bool);
#undef HANDLE_TYPE
    }
  }

  return result;
}